

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::abort(Forth *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Abort",&local_31);
  throwMessage(this,&local_30,errorAbort);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void abort() {
			throwMessage("Abort",errorAbort);
		}